

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O3

png_fixed_point png_get_x_offset_inches_fixed(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  png_fixed_point pVar1;
  
  pVar1 = 0;
  if (((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      (pVar1 = 0, (info_ptr->valid & 0x100) != 0)) && (info_ptr->offset_unit_type == '\x01')) {
    pVar1 = info_ptr->x_offset;
  }
  pVar1 = png_muldiv_warn(png_ptr,pVar1,500,0x7f);
  return pVar1;
}

Assistant:

png_fixed_point PNGAPI
png_get_x_offset_inches_fixed(png_const_structrp png_ptr,
    png_const_inforp info_ptr)
{
   return png_fixed_inches_from_microns(png_ptr,
       png_get_x_offset_microns(png_ptr, info_ptr));
}